

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_dirt.cc
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
FilesystemDirt::ExtractDirtyPath_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,FilesystemDirt *this)

{
  ulong *puVar1;
  pointer pcVar2;
  const_iterator __position;
  undefined8 *puVar3;
  undefined8 uVar4;
  anon_union_32_2_e8b08be2_for__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_2
  local_90;
  bool local_70;
  pointer local_68;
  size_type local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (this->dirty_ == true) {
    if ((this->children_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      __assert_fail("(!dirty_ || children_.empty()) && \"Dirtying should always remove children\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/filesystem_dirt.cc"
                    ,0x24,
                    "std::experimental::optional<std::string> FilesystemDirt::ExtractDirtyPath()");
    }
    this->dirty_ = false;
    local_90._M_payload._M_dataplus._M_p = (_Alloc_hider)((long)&local_90._M_payload + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
    puVar1 = (ulong *)((long)&(__return_storage_ptr__->
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ).field_0 + 0x10);
    *(ulong **)
     &(__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ).field_0 = puVar1;
    local_60 = local_90._M_payload._M_string_length;
    if (local_90._M_payload._M_dataplus._M_p == (_Alloc_hider)((long)&local_90._M_payload + 0x10)) {
      *puVar1 = local_90._16_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ).field_0 + 0x18) = local_90._24_8_;
    }
    else {
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ).field_0._M_payload._M_dataplus._M_p = (pointer)local_90._M_payload._M_dataplus._M_p;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ).field_0 + 0x10) = local_90._16_8_;
    }
    goto LAB_001199f5;
  }
  if ((this->children_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ).field_0 + 0x10) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ).field_0 + 0x18) = 0;
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
    ).field_0._M_payload._M_dataplus._M_p = (pointer)0x0;
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
    ).field_0._M_payload._M_string_length = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      )._M_engaged = 0;
    return __return_storage_ptr__;
  }
  __position._M_node = (this->children_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::operator+(&local_48,"/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (__position._M_node + 1));
  ExtractDirtyPath_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_90,(FilesystemDirt *)(__position._M_node + 2));
  uVar4 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    uVar4 = local_48.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar4 < local_90._M_payload._M_string_length + local_48._M_string_length) {
    uVar4 = 0xf;
    if (local_90._M_payload._M_dataplus._M_p != (_Alloc_hider)((long)&local_90._M_payload + 0x10)) {
      uVar4 = local_90._16_8_;
    }
    if ((ulong)uVar4 < local_90._M_payload._M_string_length + local_48._M_string_length)
    goto LAB_001198e8;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_90,0,(char *)0x0,(ulong)local_48._M_dataplus._M_p);
  }
  else {
LAB_001198e8:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_48,(ulong)local_90._M_payload._M_dataplus._M_p);
  }
  local_68 = (pointer)&local_58;
  pcVar2 = (pointer)(puVar3 + 2);
  if ((pointer)*puVar3 == pcVar2) {
    local_58 = *(undefined8 *)pcVar2;
    uStack_50 = puVar3[3];
  }
  else {
    local_58 = *(undefined8 *)pcVar2;
    local_68 = (pointer)*puVar3;
  }
  local_60 = puVar3[1];
  *puVar3 = pcVar2;
  puVar3[1] = 0;
  *pcVar2 = '\0';
  if ((local_70 == true) &&
     (local_90._M_payload._M_dataplus._M_p != (_Alloc_hider)((long)&local_90._M_payload + 0x10))) {
    operator_delete((void *)local_90._M_payload._M_dataplus._M_p,local_90._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((((FilesystemDirt *)(__position._M_node + 2))->dirty_ == false) &&
     (__position._M_node[3]._M_left == (_Base_ptr)0x0)) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>_>
    ::_M_erase_aux(&(this->children_)._M_t,__position);
  }
  puVar3 = (undefined8 *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ).field_0 + 0x10);
  *(undefined8 **)
   &(__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
    ).field_0 = puVar3;
  if (local_68 == (pointer)&local_58) {
    *puVar3 = local_58;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ).field_0 + 0x18) = uStack_50;
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
    ).field_0._M_payload._M_dataplus._M_p = local_68;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ).field_0 + 0x10) = local_58;
  }
LAB_001199f5:
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  ).field_0._M_payload._M_string_length = local_60;
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  )._M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

std::experimental::optional<std::string> FilesystemDirt::ExtractDirtyPath() {
  assert((!dirty_ || children_.empty()) &&
         "Dirtying should always remove children");
  if (dirty_) {
    // End of search: path is dirty. Return "", so that the pathname
    // components leading up to it can be prepended.
    dirty_ = false;
    return std::string("");
  } else if (!children_.empty()) {
    // Get child that is dirty and prepend the pathname compoment. Reap
    // the child in case its dirty paths are exhausted.
    auto child = children_.begin();
    std::string path("/" + child->first + *child->second.ExtractDirtyPath());
    if (!child->second.dirty_ && child->second.children_.empty())
      children_.erase(child);
    return path;
  } else {
    // There are no dirty paths.
    return {};
  }
}